

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeTestsUtil.cpp
# Opt level: O1

void vkt::compute::beginCommandBuffer(DeviceInterface *vk,VkCommandBuffer commandBuffer)

{
  VkResult result;
  VkCommandBufferBeginInfo commandBufBeginParams;
  
  result = (*vk->_vptr_DeviceInterface[0x49])();
  ::vk::checkResult(result,"vk.beginCommandBuffer(commandBuffer, &commandBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/compute/vktComputeTestsUtil.cpp"
                    ,0x110);
  return;
}

Assistant:

void beginCommandBuffer (const DeviceInterface& vk, const VkCommandBuffer commandBuffer)
{
	const VkCommandBufferBeginInfo commandBufBeginParams =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		0u,												// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &commandBufBeginParams));
}